

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Node<QWidget_*,_QRect> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QWidget*,QRect>>::findNode<QWidget*>
          (Data<QHashPrivate::Node<QWidget*,QRect>> *this,QWidget **key)

{
  byte bVar1;
  ulong uVar2;
  Node<QWidget_*,_QRect> *pNVar3;
  Bucket BVar4;
  
  uVar2 = ((ulong)*key >> 0x20 ^ (ulong)*key) * -0x2917014799a6026d;
  uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
  BVar4 = findBucketWithHash<QWidget*>(this,key,uVar2 >> 0x20 ^ *(ulong *)(this + 0x18) ^ uVar2);
  bVar1 = (BVar4.span)->offsets[BVar4.index];
  if (bVar1 == 0xff) {
    pNVar3 = (Node<QWidget_*,_QRect> *)0x0;
  }
  else {
    pNVar3 = (Node<QWidget_*,_QRect> *)(((BVar4.span)->entries->storage).data + (uint)bVar1 * 0x18);
  }
  return pNVar3;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }